

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

Dec_Graph_t * Abc_ManResubDivs1(Abc_ManRes_t *p,int Required)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Dec_Graph_t *pDVar8;
  int local_54;
  int local_50;
  int w;
  int k;
  int i;
  uint *puDataR;
  uint *puData1;
  uint *puData0;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *pObj0;
  int Required_local;
  Abc_ManRes_t *p_local;
  
  pvVar1 = (p->pRoot->field_5).pData;
  for (w = 0; iVar4 = Vec_PtrSize(p->vDivs1UP), w < iVar4; w = w + 1) {
    pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs1UP,w);
    pAVar6 = Abc_ObjRegular(pAVar5);
    pvVar2 = (pAVar6->field_5).pData;
    local_50 = w;
    while( true ) {
      local_50 = local_50 + 1;
      iVar4 = Vec_PtrSize(p->vDivs1UP);
      if (iVar4 <= local_50) break;
      pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs1UP,local_50);
      pAVar7 = Abc_ObjRegular(pAVar6);
      pvVar3 = (pAVar7->field_5).pData;
      iVar4 = Abc_ObjIsComplement(pAVar5);
      if ((iVar4 == 0) || (iVar4 = Abc_ObjIsComplement(pAVar6), iVar4 == 0)) {
        iVar4 = Abc_ObjIsComplement(pAVar5);
        if (iVar4 == 0) {
          iVar4 = Abc_ObjIsComplement(pAVar6);
          if (iVar4 == 0) {
            local_54 = 0;
            while ((local_54 < p->nWords &&
                   ((((*(uint *)((long)pvVar2 + (long)local_54 * 4) |
                      *(uint *)((long)pvVar3 + (long)local_54 * 4)) ^
                     *(uint *)((long)pvVar1 + (long)local_54 * 4)) & p->pCareSet[local_54]) == 0)))
            {
              local_54 = local_54 + 1;
            }
          }
          else {
            local_54 = 0;
            while ((local_54 < p->nWords &&
                   ((((*(uint *)((long)pvVar2 + (long)local_54 * 4) |
                      *(uint *)((long)pvVar3 + (long)local_54 * 4) ^ 0xffffffff) ^
                     *(uint *)((long)pvVar1 + (long)local_54 * 4)) & p->pCareSet[local_54]) == 0)))
            {
              local_54 = local_54 + 1;
            }
          }
        }
        else {
          local_54 = 0;
          while ((local_54 < p->nWords &&
                 ((((*(uint *)((long)pvVar2 + (long)local_54 * 4) ^ 0xffffffff |
                    *(uint *)((long)pvVar3 + (long)local_54 * 4)) ^
                   *(uint *)((long)pvVar1 + (long)local_54 * 4)) & p->pCareSet[local_54]) == 0))) {
            local_54 = local_54 + 1;
          }
        }
      }
      else {
        local_54 = 0;
        while ((local_54 < p->nWords &&
               ((((*(uint *)((long)pvVar2 + (long)local_54 * 4) ^ 0xffffffff |
                  *(uint *)((long)pvVar3 + (long)local_54 * 4) ^ 0xffffffff) ^
                 *(uint *)((long)pvVar1 + (long)local_54 * 4)) & p->pCareSet[local_54]) == 0))) {
          local_54 = local_54 + 1;
        }
      }
      if (local_54 == p->nWords) {
        p->nUsedNode1Or = p->nUsedNode1Or + 1;
        pDVar8 = Abc_ManResubQuit1(p->pRoot,pAVar5,pAVar6,1);
        return pDVar8;
      }
    }
  }
  w = 0;
  do {
    iVar4 = Vec_PtrSize(p->vDivs1UN);
    if (iVar4 <= w) {
      return (Dec_Graph_t *)0x0;
    }
    pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs1UN,w);
    pAVar6 = Abc_ObjRegular(pAVar5);
    pvVar2 = (pAVar6->field_5).pData;
    local_50 = w;
    while( true ) {
      local_50 = local_50 + 1;
      iVar4 = Vec_PtrSize(p->vDivs1UN);
      if (iVar4 <= local_50) break;
      pAVar6 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs1UN,local_50);
      pAVar7 = Abc_ObjRegular(pAVar6);
      pvVar3 = (pAVar7->field_5).pData;
      iVar4 = Abc_ObjIsComplement(pAVar5);
      if ((iVar4 != 0) && (iVar4 = Abc_ObjIsComplement(pAVar6), iVar4 != 0)) {
        local_54 = 0;
        while ((local_54 < p->nWords &&
               ((((*(uint *)((long)pvVar2 + (long)local_54 * 4) ^ 0xffffffff) &
                  (*(uint *)((long)pvVar3 + (long)local_54 * 4) ^ 0xffffffff) ^
                 *(uint *)((long)pvVar1 + (long)local_54 * 4)) & p->pCareSet[local_54]) == 0))) {
          local_54 = local_54 + 1;
        }
      }
      iVar4 = Abc_ObjIsComplement(pAVar5);
      if (iVar4 != 0) {
        local_54 = 0;
        while ((local_54 < p->nWords &&
               ((((*(uint *)((long)pvVar2 + (long)local_54 * 4) ^ 0xffffffff) &
                  *(uint *)((long)pvVar3 + (long)local_54 * 4) ^
                 *(uint *)((long)pvVar1 + (long)local_54 * 4)) & p->pCareSet[local_54]) == 0))) {
          local_54 = local_54 + 1;
        }
      }
      iVar4 = Abc_ObjIsComplement(pAVar6);
      if (iVar4 == 0) {
        local_54 = 0;
        while ((local_54 < p->nWords &&
               (((*(uint *)((long)pvVar2 + (long)local_54 * 4) &
                  *(uint *)((long)pvVar3 + (long)local_54 * 4) ^
                 *(uint *)((long)pvVar1 + (long)local_54 * 4)) & p->pCareSet[local_54]) == 0))) {
          local_54 = local_54 + 1;
        }
      }
      else {
        local_54 = 0;
        while ((local_54 < p->nWords &&
               (((*(uint *)((long)pvVar2 + (long)local_54 * 4) &
                  (*(uint *)((long)pvVar3 + (long)local_54 * 4) ^ 0xffffffff) ^
                 *(uint *)((long)pvVar1 + (long)local_54 * 4)) & p->pCareSet[local_54]) == 0))) {
          local_54 = local_54 + 1;
        }
      }
      if (local_54 == p->nWords) {
        p->nUsedNode1And = p->nUsedNode1And + 1;
        pDVar8 = Abc_ManResubQuit1(p->pRoot,pAVar5,pAVar6,0);
        return pDVar8;
      }
    }
    w = w + 1;
  } while( true );
}

Assistant:

Dec_Graph_t * Abc_ManResubDivs1( Abc_ManRes_t * p, int Required )
{
    Abc_Obj_t * pObj0, * pObj1;
    unsigned * puData0, * puData1, * puDataR;
    int i, k, w;
    puDataR = (unsigned *)p->pRoot->pData;
    // check positive unate divisors
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs1UP, pObj0, i )
    {
        puData0 = (unsigned *)Abc_ObjRegular(pObj0)->pData;
        Vec_PtrForEachEntryStart( Abc_Obj_t *, p->vDivs1UP, pObj1, k, i + 1 )
        {
            puData1 = (unsigned *)Abc_ObjRegular(pObj1)->pData;
            if ( Abc_ObjIsComplement(pObj0) && Abc_ObjIsComplement(pObj1) )
            {
                for ( w = 0; w < p->nWords; w++ )
    //                if ( (puData0[w] | puData1[w]) != puDataR[w] )
                    if ( ((~puData0[w] | ~puData1[w]) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
            }
            else if ( Abc_ObjIsComplement(pObj0) )
            {
                for ( w = 0; w < p->nWords; w++ )
    //                if ( (puData0[w] | puData1[w]) != puDataR[w] )
                    if ( ((~puData0[w] | puData1[w]) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
            }
            else if ( Abc_ObjIsComplement(pObj1) )
            {
                for ( w = 0; w < p->nWords; w++ )
    //                if ( (puData0[w] | puData1[w]) != puDataR[w] )
                    if ( ((puData0[w] | ~puData1[w]) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
            }
            else 
            {
                for ( w = 0; w < p->nWords; w++ )
    //                if ( (puData0[w] | puData1[w]) != puDataR[w] )
                    if ( ((puData0[w] | puData1[w]) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
            }
            if ( w == p->nWords )
            {
                p->nUsedNode1Or++;
                return Abc_ManResubQuit1( p->pRoot, pObj0, pObj1, 1 );
            }
        }
    }
    // check negative unate divisors
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs1UN, pObj0, i )
    {
        puData0 = (unsigned *)Abc_ObjRegular(pObj0)->pData;
        Vec_PtrForEachEntryStart( Abc_Obj_t *, p->vDivs1UN, pObj1, k, i + 1 )
        {
            puData1 = (unsigned *)Abc_ObjRegular(pObj1)->pData;
            if ( Abc_ObjIsComplement(pObj0) && Abc_ObjIsComplement(pObj1) )
            {
                for ( w = 0; w < p->nWords; w++ )
    //                if ( (puData0[w] & puData1[w]) != puDataR[w] )
                    if ( ((~puData0[w] & ~puData1[w]) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
            }
            if ( Abc_ObjIsComplement(pObj0) )
            {
                for ( w = 0; w < p->nWords; w++ )
    //                if ( (puData0[w] & puData1[w]) != puDataR[w] )
                    if ( ((~puData0[w] & puData1[w]) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
            }
            if ( Abc_ObjIsComplement(pObj1) )
            {
                for ( w = 0; w < p->nWords; w++ )
    //                if ( (puData0[w] & puData1[w]) != puDataR[w] )
                    if ( ((puData0[w] & ~puData1[w]) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
            }
            else
            {
                for ( w = 0; w < p->nWords; w++ )
    //                if ( (puData0[w] & puData1[w]) != puDataR[w] )
                    if ( ((puData0[w] & puData1[w]) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
            }
            if ( w == p->nWords )
            {
                p->nUsedNode1And++;
                return Abc_ManResubQuit1( p->pRoot, pObj0, pObj1, 0 );
            }
        }
    }
    return NULL;
}